

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O2

InferenceRule Inferences::convert(Proxy cnst)

{
  InferenceRule IVar1;
  
  IVar1 = BINARY_CONN_ELIMINATION;
  if (cnst - NOT < 4) {
    IVar1 = (InferenceRule)(0x6b696a67 >> ((char)cnst * '\b' - 0x38U & 0x1f));
  }
  return IVar1;
}

Assistant:

InferenceRule convert(Signature::Proxy cnst){
  switch(cnst){
    case Signature::PI:
      return InferenceRule::VPI_ELIMINATION;
    case Signature::SIGMA:
      return InferenceRule::VSIGMA_ELIMINATION;
    case Signature::EQUALS:
      return InferenceRule::HOL_EQUALITY_ELIMINATION;
    case Signature::NOT:
      return InferenceRule::HOL_NOT_ELIMINATION;
    default:
      return InferenceRule::BINARY_CONN_ELIMINATION;   
  }
}